

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::QueuedClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,QueuedClient *this,
          uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint)

{
  uint *puVar1;
  LocalRequest *pLVar2;
  Own<capnp::LocalRequest> hook;
  Builder root;
  uint16_t local_4a;
  Own<capnp::LocalRequest> local_48;
  Builder local_38;
  uint64_t local_20;
  Own<capnp::RequestHook> local_18;
  
  puVar1 = &(this->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_38.builder.segment = (SegmentBuilder *)&this->super_Refcounted;
  local_4a = methodId;
  local_38.builder.capTable = (CapTableBuilder *)this;
  local_20 = interfaceId;
  kj::
  heap<capnp::LocalRequest,unsigned_long&,unsigned_short&,kj::Maybe<capnp::MessageSize>&,kj::Own<capnp::QueuedClient>>
            ((kj *)&local_48,&local_20,&local_4a,sizeHint,(Own<capnp::QueuedClient> *)&local_38);
  kj::Own<capnp::QueuedClient>::dispose((Own<capnp::QueuedClient> *)&local_38);
  MessageBuilder::getRootInternal(&local_38,&(((local_48.ptr)->message).ptr)->super_MessageBuilder);
  pLVar2 = local_48.ptr;
  (__return_storage_ptr__->super_Builder).builder.pointer = local_38.builder.pointer;
  (__return_storage_ptr__->super_Builder).builder.segment = local_38.builder.segment;
  (__return_storage_ptr__->super_Builder).builder.capTable = local_38.builder.capTable;
  local_18.disposer = local_48.disposer;
  local_48.ptr = (LocalRequest *)0x0;
  (__return_storage_ptr__->hook).disposer = local_48.disposer;
  (__return_storage_ptr__->hook).ptr = &pLVar2->super_RequestHook;
  local_18.ptr = (RequestHook *)0x0;
  kj::Own<capnp::RequestHook>::dispose(&local_18);
  kj::Own<capnp::LocalRequest>::dispose(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
      uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint) override {
    auto hook = kj::heap<LocalRequest>(
        interfaceId, methodId, sizeHint, kj::addRef(*this));
    auto root = hook->message->getRoot<AnyPointer>();
    return Request<AnyPointer, AnyPointer>(root, kj::mv(hook));
  }